

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

IRegistryHub * Catch::getRegistryHub(void)

{
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub != (IRegistryHub *)0x0) {
    return (anonymous_namespace)::getTheRegistryHub()::theRegistryHub;
  }
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = (IRegistryHub *)operator_new(0xd8);
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub->_vptr_IRegistryHub =
       (_func_int **)&PTR__RegistryHub_001623a0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[1]._vptr_IRegistryHub =
       (_func_int **)&PTR__RegistryHub_001623f0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[2]._vptr_IRegistryHub =
       (_func_int **)&PTR__TestRegistry_001615f8;
  *(undefined4 *)&(anonymous_namespace)::getTheRegistryHub()::theRegistryHub[4]._vptr_IRegistryHub =
       0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[5]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[6]._vptr_IRegistryHub =
       (_func_int **)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4);
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[7]._vptr_IRegistryHub =
       (_func_int **)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4);
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[8]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[9]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[10]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xb]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xc]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xd]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xe]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xf]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x10]._vptr_IRegistryHub =
       (_func_int **)&PTR__ReporterRegistry_001625e0;
  *(undefined4 *)
   &(anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x12]._vptr_IRegistryHub = 0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x13]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x14]._vptr_IRegistryHub =
       (_func_int **)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12);
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x15]._vptr_IRegistryHub =
       (_func_int **)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12);
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x16]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x17]._vptr_IRegistryHub =
       (_func_int **)&PTR__ExceptionTranslatorRegistry_00162628;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x1a]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x18]._vptr_IRegistryHub =
       (_func_int **)0x0;
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x19]._vptr_IRegistryHub =
       (_func_int **)0x0;
  return (anonymous_namespace)::getTheRegistryHub()::theRegistryHub;
}

Assistant:

inline RegistryHub*& getTheRegistryHub() {
            static RegistryHub* theRegistryHub = NULL;
            if( !theRegistryHub )
                theRegistryHub = new RegistryHub();
            return theRegistryHub;
        }